

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O3

LispPTR gcscanstack(void)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  LispPTR *pLVar5;
  DLword *pDVar6;
  DLword *pDVar7;
  LispPTR *pLVar8;
  LispPTR *pLVar9;
  char *__format;
  LispPTR LVar10;
  LispPTR *pLVar11;
  long lVar12;
  LispPTR *pLVar13;
  LispPTR *pLVar14;
  ulong uVar15;
  LispPTR *pLVar16;
  char debugStr [100];
  char local_98 [104];
  
  pDVar7 = Lisp_world;
  lVar12 = (ulong)InterfacePage->stackbase + 0x10000;
  uVar1 = InterfacePage->endofstack;
  if ((InterfacePage->stackbase & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",lVar12);
  }
  pLVar11 = (LispPTR *)(Lisp_world + lVar12);
  if (((ulong)pLVar11 & 3) != 0) {
    sprintf(local_98,"Frame ptr (%p) not to word bound at start of gcscanstack.",pLVar11);
    error(local_98);
  }
LAB_0012490e:
  do {
    while( true ) {
      pLVar9 = pLVar11;
      uVar2 = *(ushort *)((long)pLVar9 + 2) >> 0xd;
      if (uVar2 == 5) goto LAB_00124a38;
      if (uVar2 == 6) break;
      if (uVar2 != 7) {
        LVar10 = *pLVar9;
        pDVar7 = MDStypetbl;
        do {
          if ((-1 < *(short *)((ulong)(LVar10 >> 8 & 0xffffe) + (long)pDVar7 ^ 2)) &&
             (*GcDisabled_word != 0x4c)) {
            rec_htfind(LVar10 & 0xfffffff,2);
            pDVar7 = MDStypetbl;
          }
          LVar10 = pLVar9[1];
          pLVar9 = pLVar9 + 1;
        } while( true );
      }
      if (pDVar7 + (ulong)uVar1 + 0x10000 <= pLVar9) {
        return 0;
      }
      pLVar11 = (LispPTR *)((ulong)(ushort)*pLVar9 * 2 + (long)pLVar9);
      if (((ulong)pLVar11 & 3) != 0) {
        __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_GUARD; old frame = %p.";
        goto LAB_00124c8c;
      }
    }
    uVar3 = pLVar9[1];
    uVar15 = (ulong)uVar3;
    if ((-1 < *(short *)((ulong)(uVar3 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      rec_htfind(uVar3,2);
    }
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar15);
    }
    pDVar6 = Lisp_world;
    uVar2 = Lisp_world[uVar15 + 6];
    if (0xff < uVar2) {
      lVar12 = 0;
      do {
        LVar10 = pLVar9[lVar12 + 5];
        if (((LVar10 < 0x10000000) &&
            (-1 < *(short *)((ulong)(LVar10 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar10,2);
        }
        lVar12 = lVar12 + 1;
      } while ((uint)(uVar2 >> 8) != (uint)lVar12);
    }
    pLVar11 = (LispPTR *)(Stackspace + *(ushort *)((long)pLVar9 + 10));
    pLVar8 = pLVar11;
    if ((*pLVar9 & 0x2000000) == 0) {
      pLVar13 = (LispPTR *)0x0;
    }
    else {
      uVar3 = pLVar9[3];
      if ((uVar3 & 0xffff0000) == 0x10000) {
        uVar4 = *(uint *)(pDVar6 + uVar15 + 4);
        if ((-1 < *(short *)((long)MDStypetbl + (ulong)(uVar4 >> 8 & 0xffffe) ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(uVar4 & 0xfffffff,2);
        }
        pLVar8 = (LispPTR *)(Stackspace + (uVar3 & 0xffff));
        pLVar13 = pLVar8 + (ulong)*(ushort *)((long)pLVar8 + 0xe) + 4;
      }
      else {
        if ((-1 < *(short *)((ulong)(MDStypetbl + (uVar3 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c))
        {
          rec_htfind(uVar3,2);
        }
        pLVar13 = (LispPTR *)0x0;
      }
    }
    pLVar16 = pLVar9 + (long)(short)pDVar6[uVar15 + 3] * 2 + 9;
    pLVar5 = pLVar16;
    if (((ulong)pLVar16 & 3) != 0) {
      sprintf(local_98,
              "Frame ptr (%p) not to word bound in gcscanstack() STK_FX case; old frame = %p.",
              pLVar16,pLVar9);
      error(local_98);
    }
    while( true ) {
      for (; pLVar14 = pLVar13, pLVar9 = pLVar16, pLVar5 < pLVar8; pLVar5 = pLVar5 + 1) {
        LVar10 = *pLVar9;
        if (((LVar10 < 0x10000000) &&
            (-1 < *(short *)((ulong)(LVar10 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2))) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar10,2);
        }
        pLVar16 = pLVar9 + 1;
        pLVar13 = pLVar14;
      }
      if (pLVar14 == (LispPTR *)0x0) break;
      pLVar16 = pLVar14;
      pLVar5 = pLVar14;
      pLVar13 = (LispPTR *)0x0;
      pLVar8 = pLVar11;
      if (((ulong)pLVar14 & 3) != 0) {
        sprintf(local_98,
                "Frame ptr (%p) not to word bound in gcscanstack() scantemps; old frame = %p.",
                pLVar14,pLVar9);
        error(local_98);
        pLVar13 = (LispPTR *)0x0;
      }
    }
  } while (((ulong)pLVar11 & 3) == 0);
  __format = "Frame ptr (%p) not to word bound in gcscanstack(), end scantemps; old frame = %p.";
  goto LAB_00124c8c;
LAB_00124a38:
  pLVar11 = (LispPTR *)((ulong)(ushort)*pLVar9 * 2 + (long)pLVar9);
  if (((ulong)pLVar11 & 3) == 0) goto LAB_0012490e;
  __format = "Frame ptr (%p) not to word bound in gcscanstack() STK_FSB; old frame = %p.";
LAB_00124c8c:
  sprintf(local_98,__format,pLVar11,pLVar9);
  error(local_98);
  goto LAB_0012490e;
}

Assistant:

LispPTR gcscanstack(void) {
  Bframe *basicframe;
  Bframe *obasicframe;
  LispPTR scanptr, scanend;
  UNSIGNED scanend68K;
  int ftyp;

  scanptr = VAG2(STK_HI, InterfacePage->stackbase);
  scanend = VAG2(STK_HI, InterfacePage->endofstack);
  scanend68K = (UNSIGNED)NativeAligned2FromLAddr(scanend);
  basicframe = (Bframe *)NativeAligned4FromLAddr(scanptr);

  if (0 != (3 & (UNSIGNED)basicframe)) {
    char debugStr[100];
    sprintf(debugStr,
            "Frame ptr (%p) not to word bound at start of gcscanstack.",
            (void *)basicframe);
    error(debugStr);
  }

  while (1) {
    /*This is endless loop until encountering tail of stack */

    ftyp = (int)basicframe->flags;
    switch (ftyp) {
      case STK_FX: {
        {
          struct frameex1 *frameex;
          struct fnhead *fnheader;
          frameex = (struct frameex1 *)basicframe;
          {
            LispPTR fn_head;
#ifdef BIGVM
            fn_head = (LispPTR)(frameex->fnheader);
#else
            fn_head = (LispPTR)VAG2(frameex->hi2fnheader, frameex->lofnheader);
#endif /* BIGVM */
            Stkref(fn_head);
            fnheader = (struct fnhead *)NativeAligned4FromLAddr(fn_head);
          }
          {
            int pcou;
            LispPTR *pvars;
            pvars = (LispPTR *)((DLword *)basicframe + FRAMESIZE);
            for (pcou = fnheader->nlocals; pcou-- != 0;) {
              LispPTR value;
              value = *pvars;
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              ++pvars;
            } /* for */
          }   /* int pcou */

          {
            UNSIGNED qtemp;
            UNSIGNED next;
            UNSIGNED ntend;

            next = qtemp = (UNSIGNED)NativeAligned2FromStackOffset(frameex->nextblock);
            /* this is offset */
            ntend = 0; /* init flag */
            if (frameex->validnametable) {
              LispPTR nametable;
#ifdef BIGVM
              nametable = frameex->nametable;
#define hi2nametable (nametable >> 16)
#else
              unsigned int hi2nametable;
              unsigned int lonametable;
              lonametable = frameex->lonametable;
              hi2nametable = frameex->hi2nametable;
              nametable = VAG2(hi2nametable, lonametable);
#endif /* BIGVM */
              if (STK_HI == hi2nametable) {
                Stkref(fnheader->framename);
#ifdef BIGVM
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(nametable & 0xFFFF);
#else
                qtemp = (UNSIGNED)NativeAligned2FromStackOffset(lonametable);
#endif
                ntend = (UNSIGNED)(((DLword *)qtemp) + FNHEADSIZE +
                                   (((struct fnhead *)qtemp)->ntsize) * 2);
              } else
                Stkref(nametable);
            } /* frameex->validnametable */

            obasicframe = basicframe;
            basicframe =
                (Bframe *)ADD_OFFSET(basicframe, FRAMESIZE + PADDING + (((fnheader->pv) + 1) << 2));

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack() STK_FX case; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          scantemps:
            while ((UNSIGNED)basicframe < (UNSIGNED)qtemp) {
              LispPTR value;
              value = *((LispPTR *)basicframe);
              if
                Boundp(BIND_BITS(value)) Stkref(value);
              basicframe++;
            } /* while */

            if (ntend != 0) {
              obasicframe = basicframe;
              basicframe = (Bframe *)ntend;
              if (0 != (3 & (UNSIGNED)basicframe)) {
                char debugStr[100];
                sprintf(debugStr,
                        "Frame ptr (%p) not to word bound "
                        "in gcscanstack() scantemps; old frame = %p.",
                        (void *)basicframe, (void *)obasicframe);
                error(debugStr);
              }

              qtemp = next;
              ntend = 0;
              goto scantemps;
            }

            obasicframe = basicframe;
            basicframe = (Bframe *)next;

            if (0 != (3 & (UNSIGNED)basicframe)) {
              char debugStr[100];
              sprintf(debugStr,
                      "Frame ptr (%p) not to word bound "
                      "in gcscanstack(), end scantemps; old frame = %p.",
                      (void *)basicframe, (void *)obasicframe);
              error(debugStr);
            }

          } /* LOCAL regs qtemp next */
        }   /* local regs fnheader frameex */
        break;
      }
      case STK_GUARD: /* stack's tail ? */ {
        if ((UNSIGNED)basicframe >= (UNSIGNED)scanend68K)
          return (NIL);
        else {
          obasicframe = basicframe;
          basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

          if (0 != (3 & (UNSIGNED)basicframe)) {
            char debugStr[100];
            sprintf(debugStr,
                    "Frame ptr (%p) not to word bound "
                    "in gcscanstack() STK_GUARD; old frame = %p.",
                    (void *)basicframe, (void *)obasicframe);
            error(debugStr);
          }
        }
        break;
      }
      case STK_FSB: {
        obasicframe = basicframe;
        basicframe = (Bframe *)((DLword *)basicframe + basicframe->ivar);

        if (0 != (3 & (UNSIGNED)basicframe)) {
          char debugStr[100];
          sprintf(debugStr,
                  "Frame ptr (%p) not to word bound "
                  "in gcscanstack() STK_FSB; old frame = %p.",
                  (void *)basicframe, (void *)obasicframe);
          error(debugStr);
        }

        break;
      }
      default: /* must be basic frame !! */
      {
        LispPTR bf_word;
        while (STK_BF != BF_FLAGS(bf_word = *((LispPTR *)basicframe))) {
          Stkref(PTR_BITS(bf_word));
          basicframe++;
        }
        basicframe++;
      }

        /* **** NOTE THIS CODE DOES NOT COMPILE CORRECTLY ON THE SUN 4
           {LispPTR bf_word;
           while(STK_BF != BF_FLAGS(
           bf_word = *((LispPTR *)basicframe++)))
           { Stkref(PTR_BITS(bf_word));
           }
           }
           **** */
    } /* switch */
  }   /* while(1) */
}